

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  Extension *pEVar1;
  int iVar2;
  Descriptor *pDVar3;
  LogMessage *other;
  undefined4 extraout_var;
  LogFinisher local_85 [20];
  byte local_71;
  LogMessage local_70;
  MessageLite *local_38;
  MessageLite *prototype;
  MessageLite *result;
  Extension *extension;
  MessageFactory *factory_local;
  FieldDescriptor *descriptor_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)factory;
  factory_local = (MessageFactory *)descriptor;
  descriptor_local = (FieldDescriptor *)this;
  result = (MessageLite *)MaybeNewRepeatedExtension(this,descriptor);
  prototype = RepeatedPtrFieldBase::
              AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                        ((RepeatedPtrFieldBase *)(((Extension *)result)->field_0).string_value);
  if (prototype == (Type *)0x0) {
    iVar2 = RepeatedPtrField<google::protobuf::MessageLite>::size
                      ((RepeatedPtrField<google::protobuf::MessageLite> *)result->_vptr_MessageLite)
    ;
    pEVar1 = extension;
    if (iVar2 == 0) {
      pDVar3 = FieldDescriptor::message_type((FieldDescriptor *)factory_local);
      local_38 = (MessageLite *)
                 (*(code *)(((pEVar1->field_0).string_value)->field_2)._M_allocated_capacity)
                           (pEVar1,pDVar3);
      local_71 = 0;
      if (local_38 == (MessageLite *)0x0) {
        LogMessage::LogMessage
                  (&local_70,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                   ,0x10a);
        local_71 = 1;
        other = LogMessage::operator<<(&local_70,"CHECK failed: prototype != NULL: ");
        LogFinisher::operator=(local_85,other);
      }
      if ((local_71 & 1) != 0) {
        LogMessage::~LogMessage(&local_70);
      }
    }
    else {
      local_38 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                           ((RepeatedPtrField<google::protobuf::MessageLite> *)
                            result->_vptr_MessageLite,0);
    }
    iVar2 = (*local_38->_vptr_MessageLite[4])(local_38,this->arena_);
    prototype = (MessageLite *)CONCAT44(extraout_var,iVar2);
    RepeatedPtrField<google::protobuf::MessageLite>::AddAllocated
              ((RepeatedPtrField<google::protobuf::MessageLite> *)result->_vptr_MessageLite,
               prototype);
  }
  return prototype;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(const FieldDescriptor* descriptor,
                                      MessageFactory* factory) {
  Extension* extension = MaybeNewRepeatedExtension(descriptor);

  // RepeatedPtrField<Message> does not know how to Add() since it cannot
  // allocate an abstract object, so we have to be tricky.
  MessageLite* result = extension->repeated_message_value
      ->AddFromCleared<GenericTypeHandler<MessageLite> >();
  if (result == NULL) {
    const MessageLite* prototype;
    if (extension->repeated_message_value->size() == 0) {
      prototype = factory->GetPrototype(descriptor->message_type());
      GOOGLE_CHECK(prototype != NULL);
    } else {
      prototype = &extension->repeated_message_value->Get(0);
    }
    result = prototype->New(arena_);
    extension->repeated_message_value->AddAllocated(result);
  }
  return result;
}